

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O2

void __thiscall Debug::PosixCrashHandler::teardown(PosixCrashHandler *this)

{
  long lVar1;
  sigset_t *psVar2;
  __sigset_t *p_Var3;
  byte bVar4;
  sigaction sa;
  sigset_t mysigset;
  
  bVar4 = 0;
  sigemptyset((sigset_t *)&mysigset);
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  psVar2 = (sigset_t *)&mysigset;
  p_Var3 = &sa.sa_mask;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    p_Var3->__val[0] = psVar2->__val[0];
    psVar2 = (sigset_t *)((long)psVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    p_Var3 = (__sigset_t *)((long)p_Var3 + (ulong)bVar4 * -0x10 + 8);
  }
  sa.sa_flags = 0;
  sigaction(6,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(7,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(4,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(8,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&sa,(sigaction *)0x0);
  return;
}

Assistant:

void PosixCrashHandler::teardown() {
        struct sigaction sa;
        sigset_t mysigset;
        
        sigemptyset(&mysigset);
        
        sa.sa_handler = SIG_DFL;
        sa.sa_mask = mysigset;
        sa.sa_flags = 0;

        sigaction( SIGABRT, &sa, NULL );
        sigaction( SIGSEGV, &sa, NULL );
        sigaction( SIGBUS,  &sa, NULL );
        sigaction( SIGILL,  &sa, NULL );
        sigaction( SIGFPE,  &sa, NULL );
        sigaction( SIGPIPE, &sa, NULL );
        sigaction( SIGTERM, &sa, NULL );
    }